

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Document::ReadObjects(Document *this)

{
  ObjectMap *this_00;
  Scope *pSVar1;
  undefined8 *puVar2;
  Document *pDVar3;
  int iVar4;
  Element *pEVar5;
  mapped_type pLVar6;
  mapped_type *ppLVar7;
  iterator iVar8;
  _Base_ptr p_Var9;
  allocator<char> local_71;
  char *err;
  string local_68;
  Document *local_48;
  uint64_t id;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_38;
  
  pSVar1 = (this->parser->root)._M_t.
           super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>._M_t.
           super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>.
           super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl;
  local_48 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Objects",(allocator<char> *)&err);
  pEVar5 = Scope::operator[](pSVar1,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if ((pEVar5 == (Element *)0x0) ||
     ((pEVar5->compound)._M_t.
      super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>._M_t.
      super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>.
      super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl == (Scope *)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"no Objects dictionary found",(allocator<char> *)&err);
    Util::DOMError(&local_68,(Element *)0x0);
  }
  pLVar6 = (mapped_type)operator_new(0x28);
  pDVar3 = local_48;
  pLVar6->doc = local_48;
  pLVar6->element = pEVar5;
  this_00 = &local_48->objects;
  (pLVar6->object)._M_t.
  super___uniq_ptr_impl<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>.
  _M_t.
  super__Tuple_impl<0UL,_const_Assimp::FBX::Object_*,_std::default_delete<const_Assimp::FBX::Object>_>
  .super__Head_base<0UL,_const_Assimp::FBX::Object_*,_false>._M_head_impl = (Object *)0x0;
  pLVar6->id = 0;
  pLVar6->flags = 0;
  local_68._M_dataplus._M_p = (pointer)0x0;
  ppLVar7 = std::
            map<unsigned_long,_Assimp::FBX::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
            ::operator[](this_00,(key_type_conflict1 *)&local_68);
  *ppLVar7 = pLVar6;
  pSVar1 = (pEVar5->compound)._M_t.
           super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>._M_t.
           super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>.
           super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl;
  p_Var9 = *(_Base_ptr *)((long)&(pSVar1->elements)._M_t + 0x18);
  local_38 = &pDVar3->animationStacks;
  while( true ) {
    if (p_Var9 == (_Rb_tree_node_base *)((long)&(pSVar1->elements)._M_t + 8U)) {
      return;
    }
    puVar2 = *(undefined8 **)(*(long *)(p_Var9 + 2) + 8);
    if (puVar2 == *(undefined8 **)(*(long *)(p_Var9 + 2) + 0x10)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"expected ID after object key",(allocator<char> *)&err);
      Util::DOMError(&local_68,*(Element **)(p_Var9 + 2));
    }
    id = ParseTokenAsID((Token *)*puVar2,&err);
    if (err != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,err,&local_71);
      Util::DOMError(&local_68,*(Element **)(p_Var9 + 2));
    }
    if (id == 0) break;
    iVar8 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>,_std::_Select1st<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
            ::find(&this_00->_M_t,&id);
    if ((_Rb_tree_header *)iVar8._M_node != &(pDVar3->objects)._M_t._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"encountered duplicate object id, ignoring first occurrence",
                 &local_71);
      Util::DOMWarning(&local_68,*(Element **)(p_Var9 + 2));
      std::__cxx11::string::~string((string *)&local_68);
    }
    pLVar6 = (mapped_type)operator_new(0x28);
    pEVar5 = *(Element **)(p_Var9 + 2);
    pLVar6->doc = local_48;
    pLVar6->element = pEVar5;
    (pLVar6->object)._M_t.
    super___uniq_ptr_impl<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_Assimp::FBX::Object_*,_std::default_delete<const_Assimp::FBX::Object>_>
    .super__Head_base<0UL,_const_Assimp::FBX::Object_*,_false>._M_head_impl = (Object *)0x0;
    pLVar6->id = id;
    pLVar6->flags = 0;
    ppLVar7 = std::
              map<unsigned_long,_Assimp::FBX::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
              ::operator[](this_00,&id);
    *ppLVar7 = pLVar6;
    iVar4 = strcmp(*(char **)(p_Var9 + 1),"AnimationStack");
    if (iVar4 == 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(local_38,&id);
    }
    p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"encountered object with implicitly defined id 0",&local_71);
  Util::DOMError(&local_68,*(Element **)(p_Var9 + 2));
}

Assistant:

void Document::ReadObjects()
{
    // read ID objects from "Objects" section
    const Scope& sc = parser.GetRootScope();
    const Element* const eobjects = sc["Objects"];
    if(!eobjects || !eobjects->Compound()) {
        DOMError("no Objects dictionary found");
    }

    // add a dummy entry to represent the Model::RootNode object (id 0),
    // which is only indirectly defined in the input file
    objects[0] = new LazyObject(0L, *eobjects, *this);

    const Scope& sobjects = *eobjects->Compound();
    for(const ElementMap::value_type& el : sobjects.Elements()) {

        // extract ID
        const TokenList& tok = el.second->Tokens();

        if (tok.empty()) {
            DOMError("expected ID after object key",el.second);
        }

        const char* err;
        const uint64_t id = ParseTokenAsID(*tok[0], err);
        if(err) {
            DOMError(err,el.second);
        }

        // id=0 is normally implicit
        if(id == 0L) {
            DOMError("encountered object with implicitly defined id 0",el.second);
        }

        if(objects.find(id) != objects.end()) {
            DOMWarning("encountered duplicate object id, ignoring first occurrence",el.second);
        }

        objects[id] = new LazyObject(id, *el.second, *this);

        // grab all animation stacks upfront since there is no listing of them
        if(!strcmp(el.first.c_str(),"AnimationStack")) {
            animationStacks.push_back(id);
        }
    }
}